

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O1

ir_visitor_status __thiscall
anon_unknown.dwarf_4bfab::loop_analysis::visit(loop_analysis *this,ir_loop_jump *ir)

{
  exec_node *peVar1;
  
  peVar1 = (this->state).head_sentinel.next;
  if (peVar1 != &(this->state).tail_sentinel) {
    peVar1 = peVar1 + 10;
    *(int *)&peVar1->next = *(int *)&peVar1->next + 1;
    return visit_continue;
  }
  __assert_fail("!this->state.is_empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/loop_analysis.cpp"
                ,0x1ab,
                "virtual ir_visitor_status (anonymous namespace)::loop_analysis::visit(ir_loop_jump *)"
               );
}

Assistant:

static inline bool
exec_list_is_empty(const struct exec_list *list)
{
   /* There are three ways to test whether a list is empty or not.
    *
    * - Check to see if the head sentinel's \c next is the tail sentinel.
    * - Check to see if the tail sentinel's \c prev is the head sentinel.
    * - Check to see if the head is the sentinel node by test whether its
    *   \c next pointer is \c NULL.
    *
    * The first two methods tend to generate better code on modern systems
    * because they save a pointer dereference.
    */
   return list->head_sentinel.next == &list->tail_sentinel;
}